

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O3

void Aig_ManDeriveCounterExample(Aig_Man_t *p,Vec_Int_t *vNode2Var,sat_solver *pSat)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *pVars;
  Vec_Ptr_t *pVVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = p->nObjs[2];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar1 = iVar4;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar1;
  iVar4 = 0;
  if (iVar1 == 0) {
    pVars = (int *)0x0;
  }
  else {
    pVars = (int *)malloc((long)iVar1 << 2);
  }
  p_00->pArray = pVars;
  pVVar2 = p->vCis;
  if (0 < pVVar2->nSize) {
    lVar5 = 0;
    do {
      iVar4 = *(int *)((long)pVVar2->pArray[lVar5] + 0x24);
      if (((long)iVar4 < 0) || (vNode2Var->nSize <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,vNode2Var->pArray[iVar4]);
      lVar5 = lVar5 + 1;
      pVVar2 = p->vCis;
    } while (lVar5 < pVVar2->nSize);
    pVars = p_00->pArray;
    iVar4 = p_00->nSize;
  }
  piVar3 = Sat_SolverGetModel(pSat,pVars,iVar4);
  p->pData = piVar3;
  if (pVars != (int *)0x0) {
    free(pVars);
  }
  free(p_00);
  return;
}

Assistant:

void Aig_ManDeriveCounterExample( Aig_Man_t * p, Vec_Int_t * vNode2Var, sat_solver * pSat )
{ 
    Vec_Int_t * vPisIds;
    Aig_Obj_t * pObj;
    int i;
    // collect IDs of PI variables
    // (fanoutless PIs have SAT var 0, which is an unused in the SAT solver -> has value 0)
    vPisIds = Vec_IntAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vPisIds, Vec_IntEntry(vNode2Var, Aig_ObjId(pObj)) );
    // derive the SAT assignment
    p->pData = Sat_SolverGetModel( pSat, vPisIds->pArray, vPisIds->nSize );
    Vec_IntFree( vPisIds );
}